

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O0

int base64_encode_blockend(char *code_out,base64_encodestate *state_in)

{
  base64_encodestep bVar1;
  char cVar2;
  char *local_20;
  char *codechar;
  base64_encodestate *state_in_local;
  char *code_out_local;
  
  bVar1 = state_in->step;
  local_20 = code_out;
  if (bVar1 != step_A) {
    if (bVar1 == step_B) {
      cVar2 = base64url_encode_value(state_in->result);
      *code_out = cVar2;
      code_out[1] = '=';
      local_20 = code_out + 3;
      code_out[2] = '=';
    }
    else if (bVar1 == step_C) {
      cVar2 = base64url_encode_value(state_in->result);
      *code_out = cVar2;
      local_20 = code_out + 2;
      code_out[1] = '=';
    }
  }
  *local_20 = '\n';
  return ((int)local_20 + 1) - (int)code_out;
}

Assistant:

int base64_encode_blockend(char* code_out, base64_encodestate* state_in)
{
	char* codechar = code_out;
	
	switch (state_in->step)
	{
	case step_B:
		*codechar++ = base64url_encode_value(state_in->result);
		*codechar++ = '=';
		*codechar++ = '=';
		break;
	case step_C:
		*codechar++ = base64url_encode_value(state_in->result);
		*codechar++ = '=';
		break;
	case step_A:
		break;
	}
	*codechar++ = '\n';
	
	return codechar - code_out;
}